

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall sznet::net::Connector::startInLoop(Connector *this)

{
  EventLoop *this_00;
  bool bVar1;
  socklen_t in_ECX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int in_ESI;
  SourceFile file;
  Logger local_fe8;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  __addr = extraout_RDX;
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
    __addr = extraout_RDX_00;
  }
  if (this->m_state == kDisconnected) {
    if (this->m_connect == true) {
      connect(this,in_ESI,__addr,in_ECX);
      return;
    }
    if (g_logLevel < 2) {
      file._8_8_ = 0xd;
      file.m_data = "Connector.cpp";
      Logger::Logger(&local_fe8,file,0x33,DEBUG,"startInLoop");
      if (0xe < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"do not connect",0xe);
        local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0xe;
      }
      Logger::~Logger(&local_fe8);
    }
    return;
  }
  __assert_fail("m_state == kDisconnected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                ,0x2c,"void sznet::net::Connector::startInLoop()");
}

Assistant:

void Connector::startInLoop()
{
	m_loop->assertInLoopThread();
	assert(m_state == kDisconnected);
	if (m_connect)
	{
		connect();
	}
	else
	{
		LOG_DEBUG << "do not connect";
	}
}